

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O1

string * __thiscall
pbrt::PiecewiseLinearSpectrum::ParameterString_abi_cxx11_
          (string *__return_storage_ptr__,PiecewiseLinearSpectrum *this)

{
  SpectrumHandle *in_RDX;
  long lVar1;
  uintptr_t iptr;
  ulong uVar2;
  string ret;
  string name;
  string local_78;
  string local_58;
  ulong local_38;
  
  local_38 = (ulong)this | 0x3000000000000;
  FindMatchingNamedSpectrum_abi_cxx11_(&local_58,(pbrt *)&local_38,in_RDX);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (local_58._M_string_length == 0) {
    if ((this->lambdas).nStored != 0) {
      lVar1 = 0;
      uVar2 = 0;
      do {
        local_78._M_string_length = 0;
        local_78.field_2._M_local_buf[0] = '\0';
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        detail::stringPrintfRecursive<float_const&,float_const&>
                  (&local_78,"%f %f ",(float *)((long)(this->lambdas).ptr + lVar1),
                   (float *)((long)(this->values).ptr + lVar1));
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,
                          CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                   local_78.field_2._M_local_buf[0]) + 1);
        }
        uVar2 = uVar2 + 1;
        lVar1 = lVar1 + 4;
      } while (uVar2 < (this->lambdas).nStored);
    }
  }
  else {
    detail::stringPrintfRecursive<std::__cxx11::string&>(__return_storage_ptr__,"\"%s\"",&local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PiecewiseLinearSpectrum::ParameterString() const {
    std::string name = FindMatchingNamedSpectrum(this);
    if (!name.empty())
        return StringPrintf("\"%s\"", name);

    std::string ret;
    for (size_t i = 0; i < lambdas.size(); ++i)
        ret += StringPrintf("%f %f ", lambdas[i], values[i]);
    return ret;
}